

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.h
# Opt level: O2

uint16_t __thiscall double_conversion::Bignum::DivideModuloIntBignum(Bignum *this,Bignum *other)

{
  short sVar1;
  uint factor;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint factor_00;
  uint16_t uVar5;
  int iVar6;
  
  if ((int)this->exponent_ + (int)this->used_bigits_ <
      (int)other->exponent_ + (int)other->used_bigits_) {
    uVar5 = 0;
  }
  else {
    Align(this,other);
    iVar6 = 0;
    while( true ) {
      iVar4 = (int)this->used_bigits_;
      sVar1 = other->used_bigits_;
      factor = this->bigits_buffer_[(long)iVar4 + -1];
      if (iVar4 + this->exponent_ <= (int)other->exponent_ + (int)sVar1) break;
      iVar6 = iVar6 + factor;
      SubtractTimes(this,other,factor);
    }
    uVar2 = other->bigits_buffer_[(long)(int)sVar1 + -1];
    if (sVar1 == 1) {
      this->bigits_buffer_[(long)iVar4 + -1] = factor % uVar2;
      uVar5 = (short)iVar6 + (short)(factor / uVar2);
      Clamp(this);
    }
    else {
      factor_00 = factor / (uVar2 + 1);
      iVar6 = iVar6 + factor_00;
      uVar5 = (uint16_t)iVar6;
      SubtractTimes(this,other,factor_00);
      if ((factor_00 + 1) * uVar2 <= factor) {
        while( true ) {
          uVar5 = (uint16_t)iVar6;
          bVar3 = LessEqual(other,this);
          if (!bVar3) break;
          SubtractBignum(this,other);
          iVar6 = iVar6 + 1;
        }
      }
    }
  }
  return uVar5;
}

Assistant:

int BigitLength() const { return used_bigits_ + exponent_; }